

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

Type_Conversion
chaiscript::
vector_conversion<std::vector<Returned_Converted_Config,std::allocator<Returned_Converted_Config>>>
          (void)

{
  element_type *in_RDI;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> sVar1;
  Type_Conversion TVar2;
  anon_class_1_0_00000001_for_m_func local_48 [24];
  Type_Info local_30;
  undefined1 local_11;
  anon_class_1_0_00000001_for_m_func func;
  
  local_11 = 0;
  user_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>();
  user_type<std::vector<Returned_Converted_Config,std::allocator<Returned_Converted_Config>>>();
  sVar1 = make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Type_Conversion_Impl<chaiscript::vector_conversion<std::vector<Returned_Converted_Config,std::allocator<Returned_Converted_Config>>>()::_lambda(chaiscript::Boxed_Value_const&)_1_>,chaiscript::Type_Info,chaiscript::Type_Info,chaiscript::vector_conversion<std::vector<Returned_Converted_Config,std::allocator<Returned_Converted_Config>>>()::_lambda(chaiscript::Boxed_Value_const&)_1_&>
                    ((Type_Info *)in_RDI,&local_30,local_48);
  TVar2.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = sVar1.
                super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  TVar2.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (Type_Conversion)
         TVar2.
         super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Type_Conversion vector_conversion() {
    auto func = [](const Boxed_Value &t_bv) -> Boxed_Value {
      const std::vector<Boxed_Value> &from_vec = detail::Cast_Helper<const std::vector<Boxed_Value> &>::cast(t_bv, nullptr);

      To vec;
      vec.reserve(from_vec.size());
      for (const Boxed_Value &bv : from_vec) {
        vec.push_back(detail::Cast_Helper<typename To::value_type>::cast(bv, nullptr));
      }

      return Boxed_Value(std::move(vec));
    };

    return chaiscript::make_shared<detail::Type_Conversion_Base, detail::Type_Conversion_Impl<decltype(func)>>(user_type<std::vector<Boxed_Value>>(),
                                                                                                               user_type<To>(),
                                                                                                               func);
  }